

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O1

BOOL tokens_equal(Token *t1,Token *t2)

{
  BOOL BVar1;
  int iVar2;
  bool bVar3;
  
  if (t1->type != t2->type) {
    return FALSE;
  }
  BVar1 = TRUE;
  switch(t1->type) {
  case TOK_DOLLAR_DATA_REGISTER:
  case TOK_DOLLAR_ADDRESS_REGISTER:
  case TOK_DOLLAR_GENERAL_REGISTER:
  case TOK_DOLLAR_AMODE:
  case TOK_DOLLAR_REVERSED_AMODE:
  case TOK_DOLLAR_NUMBER:
  case TOK_DOLLAR_AMODE_PTR:
  case TOK_DOLLAR_REVERSED_AMODE_PTR:
    if ((t1->u).reginfo.which != (t2->u).reginfo.which) {
      return FALSE;
    }
    if ((t1->u).reginfo.size != (t2->u).reginfo.size) {
      return FALSE;
    }
    bVar3 = (t1->u).reginfo.sgnd == (t2->u).reginfo.sgnd;
    break;
  case TOK_AMODE:
  case TOK_REVERSED_AMODE:
  case TOK_AMODE_PTR:
  case TOK_REVERSED_AMODE_PTR:
  case TOK_DATA_REGISTER:
  case TOK_ADDRESS_REGISTER:
  case TOK_TEMP_REGISTER:
    if ((t1->u).reginfo.sgnd != (t2->u).reginfo.sgnd) {
      return FALSE;
    }
    if ((t1->u).reginfo.size != (t2->u).reginfo.size) {
      return FALSE;
    }
    bVar3 = (t1->u).reginfo.which == (t2->u).reginfo.which;
    break;
  case TOK_IDENTIFIER:
  case TOK_QUOTED_STRING:
    iVar2 = strcmp((t1->u).string,(t2->u).string);
    return (uint)(iVar2 == 0);
  case TOK_NUMBER:
    bVar3 = (t1->u).string == (t2->u).string;
    break;
  default:
    goto switchD_0010637f_caseD_1e;
  case TOK_DEREF:
    if ((t1->u).reginfo.sgnd != (t2->u).reginfo.sgnd) {
      return FALSE;
    }
    bVar3 = (t1->u).reginfo.size == (t2->u).reginfo.size;
  }
  BVar1 = (BOOL)bVar3;
switchD_0010637f_caseD_1e:
  return BVar1;
}

Assistant:

BOOL
tokens_equal (const Token *t1, const Token *t2)
{
  if (t1->type != t2->type)
    return FALSE;

  switch (t1->type) {
  case TOK_IDENTIFIER:
  case TOK_QUOTED_STRING:
    return !strcmp (t1->u.string, t2->u.string);
  case TOK_NUMBER:
    return (t1->u.n == t2->u.n);
  case TOK_DOLLAR_AMODE:
  case TOK_DOLLAR_REVERSED_AMODE:
  case TOK_DOLLAR_AMODE_PTR:
  case TOK_DOLLAR_REVERSED_AMODE_PTR:
  case TOK_DOLLAR_NUMBER:
  case TOK_DOLLAR_DATA_REGISTER:
  case TOK_DOLLAR_ADDRESS_REGISTER:
  case TOK_DOLLAR_GENERAL_REGISTER:
    return (t1->u.dollarinfo.which == t2->u.dollarinfo.which
	    && t1->u.dollarinfo.size == t2->u.dollarinfo.size
	    && t1->u.dollarinfo.sgnd == t2->u.dollarinfo.sgnd);
  case TOK_DEREF:
    return (t1->u.derefinfo.sgnd == t2->u.derefinfo.sgnd
	    && t1->u.derefinfo.size == t2->u.derefinfo.size);
  case TOK_AMODE:
  case TOK_REVERSED_AMODE:
  case TOK_AMODE_PTR:
  case TOK_REVERSED_AMODE_PTR:
    return (t1->u.amodeinfo.sgnd == t2->u.amodeinfo.sgnd
	    && t1->u.amodeinfo.size == t2->u.amodeinfo.size
	    && t1->u.amodeinfo.which == t2->u.amodeinfo.which);
  case TOK_DATA_REGISTER:
  case TOK_ADDRESS_REGISTER:
  case TOK_TEMP_REGISTER:
    return (t1->u.reginfo.sgnd == t2->u.reginfo.sgnd
	    && t1->u.reginfo.size == t2->u.reginfo.size
	    && t1->u.reginfo.which == t2->u.reginfo.which);
  default:
    return TRUE;
  }
}